

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O1

void __thiscall QSynth::createSynth(QSynth *this)

{
  Synth *pSVar1;
  
  pSVar1 = this->synth;
  if (pSVar1 != (Synth *)0x0) {
    MT32Emu::Synth::~Synth(pSVar1);
    operator_delete(pSVar1,0x101e8);
  }
  pSVar1 = (Synth *)operator_new(0x101e8);
  MT32Emu::Synth::Synth(pSVar1,(ReportHandler *)0x0);
  this->synth = pSVar1;
  MT32Emu::Synth::setReportHandler2(pSVar1,&(this->reportHandler).super_ReportHandler2);
  return;
}

Assistant:

void QSynth::createSynth() {
	delete synth;
	synth = new Synth;
	synth->setReportHandler2(&reportHandler);
}